

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3MsrIncrNext
              (Fts3Table *p,Fts3MultiSegReader *pMsr,sqlite3_int64 *piDocid,char **paPoslist,
              int *pnPoslist)

{
  int nSegment;
  Fts3SegReader **ppFVar1;
  long lVar2;
  Fts3SegReader *pReader;
  int iVar3;
  int iVar4;
  Fts3SegReader **ppFVar5;
  long lVar6;
  int nList;
  char *pList;
  char **local_50;
  long *local_48;
  int *local_40;
  _func_int_Fts3SegReader_ptr_Fts3SegReader_ptr *local_38;
  
  nSegment = pMsr->nAdvance;
  local_38 = fts3SegReaderDoclistCmpRev;
  if (p->bDescIdx == '\0') {
    local_38 = fts3SegReaderDoclistCmp;
  }
  if ((long)nSegment == 0) {
    *paPoslist = (char *)0x0;
  }
  else {
    ppFVar1 = pMsr->apSegment;
    ppFVar5 = ppFVar1;
    local_50 = paPoslist;
    local_48 = piDocid;
    local_40 = pnPoslist;
    while ((*ppFVar5)->pOffsetList != (char *)0x0) {
      lVar2 = (*ppFVar1)->iDocid;
      iVar3 = fts3SegReaderNextDocid(p,*ppFVar1,&pList,&nList);
      for (lVar6 = 1; (iVar3 == 0 && (lVar6 < nSegment)); lVar6 = lVar6 + 1) {
        pReader = ppFVar1[lVar6];
        if ((pReader->pOffsetList == (char *)0x0) || (pReader->iDocid != lVar2)) goto LAB_001a7db0;
        iVar3 = fts3SegReaderNextDocid(p,pReader,(char **)0x0,(int *)0x0);
      }
      if (iVar3 != 0) {
        return iVar3;
      }
LAB_001a7db0:
      fts3SegReaderSort(pMsr->apSegment,nSegment,(int)lVar6,local_38);
      iVar3 = nList;
      if ((0 < nList) && ((*ppFVar1)->ppNextElem != (Fts3HashElem **)0x0)) {
        iVar4 = fts3MsrBufferData(pMsr,pList,nList + 1);
        if (iVar4 != 0) {
          return iVar4;
        }
        pList = pMsr->aBuffer;
      }
      if (-1 < pMsr->iColFilter) {
        fts3ColumnFilter(pMsr->iColFilter,1,&pList,&nList);
        iVar3 = nList;
      }
      if (0 < iVar3) {
        *local_50 = pList;
        *local_48 = lVar2;
        *local_40 = iVar3;
        return 0;
      }
      ppFVar5 = pMsr->apSegment;
    }
    *local_50 = (char *)0x0;
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3MsrIncrNext(
  Fts3Table *p,                   /* Virtual table handle */
  Fts3MultiSegReader *pMsr,       /* Multi-segment-reader handle */
  sqlite3_int64 *piDocid,         /* OUT: Docid value */
  char **paPoslist,               /* OUT: Pointer to position list */
  int *pnPoslist                  /* OUT: Size of position list in bytes */
){
  int nMerge = pMsr->nAdvance;
  Fts3SegReader **apSegment = pMsr->apSegment;
  int (*xCmp)(Fts3SegReader *, Fts3SegReader *) = (
    p->bDescIdx ? fts3SegReaderDoclistCmpRev : fts3SegReaderDoclistCmp
  );

  if( nMerge==0 ){
    *paPoslist = 0;
    return SQLITE_OK;
  }

  while( 1 ){
    Fts3SegReader *pSeg;
    pSeg = pMsr->apSegment[0];

    if( pSeg->pOffsetList==0 ){
      *paPoslist = 0;
      break;
    }else{
      int rc;
      char *pList;
      int nList;
      int j;
      sqlite3_int64 iDocid = apSegment[0]->iDocid;

      rc = fts3SegReaderNextDocid(p, apSegment[0], &pList, &nList);
      j = 1;
      while( rc==SQLITE_OK 
        && j<nMerge
        && apSegment[j]->pOffsetList
        && apSegment[j]->iDocid==iDocid
      ){
        rc = fts3SegReaderNextDocid(p, apSegment[j], 0, 0);
        j++;
      }
      if( rc!=SQLITE_OK ) return rc;
      fts3SegReaderSort(pMsr->apSegment, nMerge, j, xCmp);

      if( nList>0 && fts3SegReaderIsPending(apSegment[0]) ){
        rc = fts3MsrBufferData(pMsr, pList, nList+1);
        if( rc!=SQLITE_OK ) return rc;
        assert( (pMsr->aBuffer[nList] & 0xFE)==0x00 );
        pList = pMsr->aBuffer;
      }

      if( pMsr->iColFilter>=0 ){
        fts3ColumnFilter(pMsr->iColFilter, 1, &pList, &nList);
      }

      if( nList>0 ){
        *paPoslist = pList;
        *piDocid = iDocid;
        *pnPoslist = nList;
        break;
      }
    }
  }

  return SQLITE_OK;
}